

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.hpp
# Opt level: O2

back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
 base64::encode<char_const*,std::back_insert_iterator<std::__cxx11::string>>
           (char *in_begin,char *in_end,
           back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           out,alphabet alphabet)

{
  byte bVar1;
  byte bVar2;
  char *pcVar3;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  out_local;
  
  pcVar3 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/";
  out_local.container = out.container;
  if (alphabet == url_filename_safe) {
    pcVar3 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-_";
  }
  while( true ) {
    if (in_begin == in_end) {
      return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )out_local.container;
    }
    bVar1 = *in_begin;
    httplib::detail::std::
    back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator=(&out_local,pcVar3 + (bVar1 >> 2));
    if ((byte *)in_begin + 1 == (byte *)in_end) break;
    bVar2 = ((byte *)in_begin)[1];
    httplib::detail::std::
    back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator=(&out_local,pcVar3 + ((uint)(bVar2 >> 4) | (bVar1 & 3) << 4));
    if ((byte *)in_begin + 2 == (byte *)in_end) {
      httplib::detail::std::
      back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator=(&out_local,pcVar3 + (ulong)(bVar2 & 0xf) * 4);
      goto LAB_00185347;
    }
    bVar1 = ((byte *)in_begin)[2];
    httplib::detail::std::
    back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator=(&out_local,pcVar3 + ((uint)(bVar1 >> 6) + (bVar2 & 0xf) * 4));
    httplib::detail::std::
    back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator=(&out_local,pcVar3 + (bVar1 & 0x3f));
    in_begin = (char *)((byte *)in_begin + 3);
  }
  httplib::detail::std::
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::operator=(&out_local,pcVar3 + ((bVar1 & 3) << 4));
  std::__cxx11::string::push_back((char)out_local.container);
LAB_00185347:
  std::__cxx11::string::push_back((char)out_local.container);
  return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )out_local.container;
}

Assistant:

static Output_iterator encode(Input_iterator in_begin, Input_iterator in_end, Output_iterator out,
                                  alphabet alphabet = alphabet::standard)
    {
        constexpr auto pad = '=';
        const char* alpha  = alphabet == alphabet::url_filename_safe
                                ? "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-_"
                                : "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/";

        while (in_begin != in_end) {
            std::uint8_t i0 = 0, i1 = 0, i2 = 0;

            // first character
            i0 = static_cast<std::uint8_t>(*in_begin);
            ++in_begin;

            *out = alpha[i0 >> 2 & 0x3f];
            ++out;

            // part of first character and second
            if (in_begin != in_end) {
                i1 = static_cast<std::uint8_t>(*in_begin);
                ++in_begin;

                *out = alpha[((i0 & 0x3) << 4) | (i1 >> 4 & 0x0f)];
                ++out;
            } else {
                *out = alpha[(i0 & 0x3) << 4];
                ++out;

                // last padding
                *out = pad;
                ++out;

                // last padding
                *out = pad;
                ++out;

                break;
            }

            // part of second character and third
            if (in_begin != in_end) {
                i2 = static_cast<std::uint8_t>(*in_begin);
                ++in_begin;

                *out = alpha[((i1 & 0xf) << 2) | (i2 >> 6 & 0x03)];
                ++out;
            } else {
                *out = alpha[(i1 & 0xf) << 2];
                ++out;

                // last padding
                *out = pad;
                ++out;

                break;
            }

            // rest of third
            *out = alpha[i2 & 0x3f];
            ++out;
        }

        return out;
    }